

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::WatWriter::WriteBeginGlobal(WatWriter *this,Global *global)

{
  string_view str;
  Global *global_local;
  WatWriter *this_local;
  
  WriteOpenSpace(this,"global");
  str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)global);
  WriteNameOrIndex(this,str,this->global_index_,Space);
  WriteInlineExports(this,Global,this->global_index_);
  WriteInlineImport(this,Global,this->global_index_);
  if ((global->mutable_ & 1U) == 0) {
    WriteType(this,global->type,Space);
  }
  else {
    WriteOpenSpace(this,"mut");
    WriteType(this,global->type,Space);
    WriteCloseSpace(this);
  }
  this->global_index_ = this->global_index_ + 1;
  return;
}

Assistant:

void WatWriter::WriteBeginGlobal(const Global& global) {
  WriteOpenSpace("global");
  WriteNameOrIndex(global.name, global_index_, NextChar::Space);
  WriteInlineExports(ExternalKind::Global, global_index_);
  WriteInlineImport(ExternalKind::Global, global_index_);
  if (global.mutable_) {
    WriteOpenSpace("mut");
    WriteType(global.type, NextChar::Space);
    WriteCloseSpace();
  } else {
    WriteType(global.type, NextChar::Space);
  }
  global_index_++;
}